

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O0

BlendEquation vkt::pipeline::mapVkBlendOp(VkBlendOp blendOp)

{
  BlendEquation local_c;
  VkBlendOp blendOp_local;
  
  switch(blendOp) {
  case VK_BLEND_OP_ADD:
    local_c = BLENDEQUATION_ADD;
    break;
  case VK_BLEND_OP_SUBTRACT:
    local_c = BLENDEQUATION_SUBTRACT;
    break;
  case VK_BLEND_OP_REVERSE_SUBTRACT:
    local_c = BLENDEQUATION_REVERSE_SUBTRACT;
    break;
  case VK_BLEND_OP_MIN:
    local_c = BLENDEQUATION_MIN;
    break;
  case VK_BLEND_OP_MAX:
    local_c = BLENDEQUATION_MAX;
    break;
  default:
    local_c = BLENDEQUATION_LAST;
  }
  return local_c;
}

Assistant:

rr::BlendEquation mapVkBlendOp (VkBlendOp blendOp)
{
	switch (blendOp)
	{
		case VK_BLEND_OP_ADD:					return rr::BLENDEQUATION_ADD;
		case VK_BLEND_OP_SUBTRACT:				return rr::BLENDEQUATION_SUBTRACT;
		case VK_BLEND_OP_REVERSE_SUBTRACT:		return rr::BLENDEQUATION_REVERSE_SUBTRACT;
		case VK_BLEND_OP_MIN:					return rr::BLENDEQUATION_MIN;
		case VK_BLEND_OP_MAX:					return rr::BLENDEQUATION_MAX;
		default:
			DE_ASSERT(false);
	}
	return rr::BLENDEQUATION_LAST;
}